

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

Promise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_> __thiscall
kj::Promise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>>::
attach<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::QuestionRef>>
          (Promise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>> *this,
          Own<capnp::_::(anonymous_namespace)::RpcConnectionState::QuestionRef> *attachments)

{
  Disposer *pDVar1;
  QuestionRef *pQVar2;
  AttachmentPromiseNodeBase *this_00;
  undefined8 *in_RDX;
  PromiseNode *extraout_RDX;
  Promise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_> PVar3;
  Own<capnp::_::(anonymous_namespace)::RpcConnectionState::QuestionRef> local_58;
  Own<kj::_::AttachmentPromiseNode<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::QuestionRef>_>_>
  local_48;
  Own<kj::_::PromiseNode> local_38;
  
  pDVar1 = (Disposer *)*in_RDX;
  pQVar2 = (QuestionRef *)in_RDX[1];
  in_RDX[1] = 0;
  local_58.disposer = pDVar1;
  local_58.ptr = pQVar2;
  this_00 = (AttachmentPromiseNodeBase *)operator_new(0x28);
  kj::_::AttachmentPromiseNodeBase::AttachmentPromiseNodeBase
            (this_00,(Own<kj::_::PromiseNode> *)attachments);
  (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0066f880;
  this_00[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)pDVar1;
  this_00[1].dependency.disposer = (Disposer *)pQVar2;
  local_58.ptr = (QuestionRef *)0x0;
  local_48.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::_::AttachmentPromiseNode<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::QuestionRef>>>
        ::instance;
  local_38.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::_::AttachmentPromiseNode<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::QuestionRef>>>
        ::instance;
  local_48.ptr = (AttachmentPromiseNode<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::QuestionRef>_>
                  *)0x0;
  *(undefined8 **)this =
       &kj::_::
        HeapDisposer<kj::_::AttachmentPromiseNode<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::QuestionRef>>>
        ::instance;
  *(AttachmentPromiseNodeBase **)(this + 8) = this_00;
  local_38.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode>::dispose(&local_38);
  Own<kj::_::AttachmentPromiseNode<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::QuestionRef>_>_>
  ::~Own(&local_48);
  Own<capnp::_::(anonymous_namespace)::RpcConnectionState::QuestionRef>::~Own(&local_58);
  PVar3.super_PromiseBase.node.ptr = extraout_RDX;
  PVar3.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>)
         PVar3.super_PromiseBase.node;
}

Assistant:

Promise<T> Promise<T>::attach(Attachments&&... attachments) {
  return Promise(false, kj::heap<_::AttachmentPromiseNode<Tuple<Attachments...>>>(
      kj::mv(node), kj::tuple(kj::fwd<Attachments>(attachments)...)));
}